

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::ReporterConfig::ReporterConfig(ReporterConfig *this,IConfigPtr *_fullConfig)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  int iVar2;
  undefined4 extraout_var;
  
  iVar2 = (*(((_fullConfig->super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr)->super_NonCopyable)._vptr_NonCopyable[3])();
  this->m_stream = (ostream *)CONCAT44(extraout_var,iVar2);
  (this->m_fullConfig).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (_fullConfig->super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  p_Var1 = (_fullConfig->super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (this->m_fullConfig).super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(p_Var1 + 8) = *(int *)(p_Var1 + 8) + 1;
    }
  }
  return;
}

Assistant:

ReporterConfig::ReporterConfig( IConfigPtr const& _fullConfig )
    :   m_stream( &_fullConfig->stream() ), m_fullConfig( _fullConfig ) {}